

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O3

bool __thiscall
r_comp::RepliStruct::parseDirective
          (RepliStruct *this,istream *stream,uint64_t *curIndent,uint64_t *prevIndent)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  bool bVar8;
  int64_t iVar9;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  uint64_t *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"!","");
  while (lVar4 = *(long *)(*(long *)stream + -0x18), ((byte)stream[lVar4 + 0x20] & 2) == 0) {
    cVar1 = std::istream::peek();
    if (cVar1 < '!') {
      lVar4 = *(long *)(*(long *)stream + -0x18);
      break;
    }
    std::istream::get();
    std::__cxx11::string::push_back((char)&local_98);
  }
  if (((byte)stream[lVar4 + 0x20] & 2) == 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_98);
    local_58 = curIndent;
    if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_98), iVar2 == 0)) {
      iVar9 = 2;
LAB_0011fb05:
      bVar8 = false;
LAB_0011fb2c:
      std::__cxx11::string::_M_assign((string *)&this->cmd);
      if (bVar8) {
        while (uVar3 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20),
              (uVar3 & 2) == 0) {
          iVar2 = std::istream::peek();
          if (iVar2 < 0xe) {
            uVar3 = *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20);
            break;
          }
          std::istream::get();
        }
        bVar8 = true;
        if ((uVar3 & 2) == 0) {
          do {
            iVar2 = std::istream::peek();
            if (0x1f < iVar2) break;
            iVar2 = std::istream::get();
            if (iVar2 == 10) {
              GlobalLine = GlobalLine + 1;
            }
          } while (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0);
        }
        goto LAB_0011fad8;
      }
      iVar9 = parse(this,stream,local_58,prevIndent,iVar9);
      if (iVar9 == 0) {
        bVar8 = true;
        goto LAB_0011fad8;
      }
      std::operator+(&local_50,"Error parsing the arguments for directive \'",&this->cmd);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_78 = &local_68;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = puVar6[3];
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*puVar6;
      }
      local_70 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->error,(ulong)local_78);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar2 == 0) {
        iVar9 = 1;
        goto LAB_0011fb05;
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_98);
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_98), iVar2 == 0)) {
        iVar9 = 1;
        bVar8 = false;
LAB_0011fb23:
        this->type = Condition;
        goto LAB_0011fb2c;
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_98);
      bVar8 = true;
      if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_98), iVar2 == 0)) {
        iVar9 = 0;
        goto LAB_0011fb23;
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_98);
      if ((((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_98), iVar2 == 0))
          || (iVar2 = std::__cxx11::string::compare((char *)&local_98), iVar2 == 0)) ||
         (iVar2 = std::__cxx11::string::compare((char *)&local_98), iVar2 == 0)) {
        iVar9 = 1;
        goto LAB_0011fb05;
      }
      std::operator+(&local_50,"Unknown directive: \'",&local_98);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_78 = &local_68;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_68 = *plVar7;
        lStack_60 = plVar5[3];
      }
      else {
        local_68 = *plVar7;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&this->error,(ulong)local_78);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::append((char *)&this->error);
  }
  bVar8 = false;
LAB_0011fad8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool RepliStruct::parseDirective(std::istream *stream, uint64_t &curIndent, uint64_t &prevIndent)
{
    std::string str = "!";
    // RepliStruct* subStruct;
    char c;

    // We know that parent read a '!', so first find out which directive
    while ((!stream->eof()) && ((c = stream->peek()) > 32)) {
        str += stream->get();
    }

    if (stream->eof()) {
        error += "Error in directive formatting, end of file reached unexpectedly. ";
        return false;
    }

    unsigned int paramCount = 0;

    if (str.compare("!def") == 0) { // () ()
        paramCount = 2;
    } else if (str.compare("!counter") == 0) { // xxx val
        paramCount = 2;
    } else if (str.compare("!undef") == 0) { // xxx
        paramCount = 1;
    } else if (str.compare("!ifdef") == 0) { // name
        this->type = Condition;
        paramCount = 1;
    } else if (str.compare("!ifundef") == 0) { // name
        this->type = Condition;
        paramCount = 1;
    } else if (str.compare("!else") == 0) { //
        this->type = Condition;
        paramCount = 0;
    } else if (str.compare("!endif") == 0) { //
        this->type = Condition;
        paramCount = 0;
    } else if (str.compare("!class") == 0) { // ()
        paramCount = 1;
    } else if (str.compare("!op") == 0) { // ():xxx
        paramCount = 1;
    } else if (str.compare("!dfn") == 0) { // ()
        paramCount = 1;
    } else if (str.compare("!load") == 0) { // xxx
        paramCount = 1;
    } else {
        error += "Unknown directive: '" + str + "'. ";
        return false;
    }

    cmd = str;

    if (paramCount == 0) {
        // read until end of line, including any comments
        while ((!stream->eof()) && (stream->peek() > 13)) {
            stream->get();
        }

        // read the end of line too
        while ((!stream->eof()) && (stream->peek() < 32))
            if (stream->get() == '\n') {
                GlobalLine++;
            }

        return true;
    }

    if (parse(stream, curIndent, prevIndent, paramCount) != 0) {
        error += "Error parsing the arguments for directive '" + cmd + "'. ";
        return false;
    } else {
        return true;
    }
}